

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * CoreML::Model::enforceTypeInvariant
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                   *allowedFeatureTypes,FeatureType *featureType)

{
  bool bVar1;
  reference other;
  FeatureType *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *__range1;
  FeatureType *featureType_local;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowedFeatureTypes_local;
  
  __end1 = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::begin
                     (allowedFeatureTypes);
  t = (FeatureType *)
      std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::end
                (allowedFeatureTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CoreML::FeatureType_*,_std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>_>
                                *)&t);
    if (!bVar1) {
      Result::featureTypeInvariantError(__return_storage_ptr__,allowedFeatureTypes,featureType);
      return __return_storage_ptr__;
    }
    other = __gnu_cxx::
            __normal_iterator<const_CoreML::FeatureType_*,_std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>_>
            ::operator*(&__end1);
    bVar1 = FeatureType::operator==(featureType,other);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_CoreML::FeatureType_*,_std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>_>
    ::operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::enforceTypeInvariant(const std::vector<FeatureType>& allowedFeatureTypes,
                                       FeatureType featureType) {
        
        for (const FeatureType& t : allowedFeatureTypes) {
            if (featureType == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        return Result::featureTypeInvariantError(allowedFeatureTypes, featureType);
    }